

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreensurface.cpp
# Opt level: O3

QSurfaceFormat __thiscall QOffscreenSurface::format(QOffscreenSurface *this)

{
  long lVar1;
  long *plVar2;
  long in_RSI;
  
  lVar1 = *(long *)(in_RSI + 8);
  plVar2 = *(long **)(lVar1 + 0x80);
  if (plVar2 == (long *)0x0) {
    plVar2 = *(long **)(lVar1 + 0x88);
    if (plVar2 == (long *)0x0) {
      QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)this,(QSurfaceFormat *)(lVar1 + 0x90));
    }
    else {
      (**(code **)(*plVar2 + 0x68))(this,plVar2);
    }
  }
  else {
    (**(code **)(*plVar2 + 0x10))(this,plVar2);
  }
  return (QSurfaceFormat)(QSurfaceFormatPrivate *)this;
}

Assistant:

QSurfaceFormat QOffscreenSurface::format() const
{
    Q_D(const QOffscreenSurface);
    if (d->platformOffscreenSurface)
        return d->platformOffscreenSurface->format();
    if (d->offscreenWindow)
        return d->offscreenWindow->format();
    return d->requestedFormat;
}